

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall
cs::domain_manager::add_var_no_return<std::__cxx11::string&>
          (domain_manager *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,var *val)

{
  bool bVar1;
  runtime_error *this_00;
  string *str;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_fffffffffffffef8;
  runtime_error *in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff17;
  var *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  domain_type *in_stack_ffffffffffffff28;
  stack_type<cs::domain_type,_std::allocator> *in_stack_ffffffffffffff40;
  string local_78 [104];
  string *local_10;
  
  local_10 = in_RSI;
  if (**(long **)in_RDI == 0) {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_ffffffffffffff40);
    bVar1 = domain_type::add_var_optimal
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                       ,(bool)in_stack_ffffffffffffff17);
    if (!bVar1) {
      str = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&stack0xffffffffffffff18,local_10);
      std::operator+((char *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff00);
      std::operator+(in_RDI,(char *)in_stack_ffffffffffffff00);
      runtime_error::runtime_error(in_stack_ffffffffffffff00,str);
      __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_ffffffffffffff40);
    bVar1 = domain_type::add_var_optimal
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                       ,(bool)in_stack_ffffffffffffff17);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string(local_78,local_10);
      std::operator+((char *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      std::operator+(in_RDI,(char *)this_00);
      runtime_error::runtime_error(this_00,in_stack_fffffffffffffef8);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void add_var_no_return(T &&name, const var &val)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
		}